

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

LIBSSH2_CHANNEL *
libssh2_channel_direct_tcpip_ex(LIBSSH2_SESSION *session,char *host,int port,char *shost,int sport)

{
  int iVar1;
  time_t start_time;
  int rc;
  time_t entry_time;
  LIBSSH2_CHANNEL *ptr;
  int sport_local;
  char *shost_local;
  int port_local;
  char *host_local;
  LIBSSH2_SESSION *session_local;
  
  if (session == (LIBSSH2_SESSION *)0x0) {
    session_local = (LIBSSH2_SESSION *)0x0;
  }
  else {
    start_time = time((time_t *)0x0);
    while (((session_local = (LIBSSH2_SESSION *)channel_direct_tcpip(session,host,port,shost,sport),
            session != (LIBSSH2_SESSION *)0x0 && (session->api_block_mode != 0)) &&
           (session_local == (LIBSSH2_SESSION *)0x0))) {
      iVar1 = libssh2_session_last_errno(session);
      if (iVar1 != -0x25) {
        return (LIBSSH2_CHANNEL *)0x0;
      }
      iVar1 = _libssh2_wait_socket(session,start_time);
      if (iVar1 != 0) {
        return (LIBSSH2_CHANNEL *)0x0;
      }
    }
  }
  return (LIBSSH2_CHANNEL *)session_local;
}

Assistant:

LIBSSH2_API LIBSSH2_CHANNEL *
libssh2_channel_direct_tcpip_ex(LIBSSH2_SESSION *session, const char *host,
                                int port, const char *shost, int sport)
{
    LIBSSH2_CHANNEL *ptr;

    if(!session)
        return NULL;

    BLOCK_ADJUST_ERRNO(ptr, session,
                       channel_direct_tcpip(session, host, port,
                                            shost, sport));
    return ptr;
}